

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O0

void NJDNode_add_string(NJDNode *node,char *str)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *in_RSI;
  long *in_RDI;
  char *c;
  
  if (in_RSI != (char *)0x0) {
    if (*in_RDI == 0) {
      pcVar1 = strdup(in_RSI);
      *in_RDI = (long)pcVar1;
    }
    else {
      sVar2 = strlen((char *)*in_RDI);
      sVar3 = strlen(in_RSI);
      pcVar1 = (char *)calloc(sVar2 + sVar3 + 1,1);
      strcpy(pcVar1,(char *)*in_RDI);
      strcat(pcVar1,in_RSI);
      free((void *)*in_RDI);
      *in_RDI = (long)pcVar1;
    }
  }
  return;
}

Assistant:

void NJDNode_add_string(NJDNode * node, const char *str)
{
   char *c;

   if (str != NULL) {
      if (node->string == NULL) {
         node->string = strdup(str);
      } else {
         c = (char *) calloc(strlen(node->string) + strlen(str) + 1, sizeof(char));
         strcpy(c, node->string);
         strcat(c, str);
         free(node->string);
         node->string = c;
      }
   }
}